

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rkvstore_test.cc
# Opt level: O0

int test_describe_instance_config(void)

{
  code *pcVar1;
  char *__s;
  RkvstoreDescribeInstanceConfigRequestType *pRVar2;
  HttpTestListener *pHVar3;
  allocator<char> local_1a9;
  int ret;
  HttpTestListener *local_188;
  HttpTestListener *listener;
  string local_178;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [55];
  allocator<char> local_f1;
  string local_f0 [32];
  RkvstoreDescribeInstanceConfigRequestType *local_d0;
  Rkvstore *rkvstore;
  RkvstoreDescribeInstanceConfigResponseType resp;
  RkvstoreDescribeInstanceConfigRequestType req;
  
  aliyun::RkvstoreDescribeInstanceConfigRequestType::RkvstoreDescribeInstanceConfigRequestType
            ((RkvstoreDescribeInstanceConfigRequestType *)((long)&resp.config.field_2 + 8));
  aliyun::RkvstoreDescribeInstanceConfigResponseType::RkvstoreDescribeInstanceConfigResponseType
            ((RkvstoreDescribeInstanceConfigResponseType *)&rkvstore);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"cn-hangzhou",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_128,"my_appid",&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_150,"my_secret",&local_151);
  pRVar2 = (RkvstoreDescribeInstanceConfigRequestType *)
           aliyun::Rkvstore::CreateRkvstoreClient(local_f0,local_128,local_150);
  std::__cxx11::string::~string(local_150);
  std::allocator<char>::~allocator(&local_151);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pRVar2;
  if (pRVar2 == (RkvstoreDescribeInstanceConfigRequestType *)0x0) {
    aliyun::RkvstoreDescribeInstanceConfigResponseType::~RkvstoreDescribeInstanceConfigResponseType
              ((RkvstoreDescribeInstanceConfigResponseType *)&rkvstore);
    aliyun::RkvstoreDescribeInstanceConfigRequestType::~RkvstoreDescribeInstanceConfigRequestType
              ((RkvstoreDescribeInstanceConfigRequestType *)((long)&resp.config.field_2 + 8));
    return 0;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"127.0.0.1:12234",(allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetProxyHost((Rkvstore *)pRVar2,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&listener + 7));
  aliyun::Rkvstore::SetUseTls((Rkvstore *)local_d0,false);
  pHVar3 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar3,0x2fca);
  __s = test_describe_instance_config_response;
  local_188 = pHVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&ret,__s,&local_1a9);
  HttpTestListener::SetResponseBody(pHVar3,(string *)&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::allocator<char>::~allocator(&local_1a9);
  HttpTestListener::Start(local_188);
  std::__cxx11::string::operator=((string *)(resp.config.field_2._M_local_buf + 8),"OwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.owner_id.field_2._M_local_buf + 8),"ResourceOwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_account.field_2._M_local_buf + 8),"ResourceOwnerId");
  std::__cxx11::string::operator=
            ((string *)(req.resource_owner_id.field_2._M_local_buf + 8),"OwnerAccount");
  std::__cxx11::string::operator=
            ((string *)(req.owner_account.field_2._M_local_buf + 8),"InstanceId");
  aliyun::Rkvstore::DescribeInstanceConfig
            (local_d0,(RkvstoreDescribeInstanceConfigResponseType *)((long)&resp.config.field_2 + 8)
             ,(RkvstoreErrorInfo *)&rkvstore);
  HttpTestListener::WaitComplete(local_188);
  pHVar3 = local_188;
  if (local_188 != (HttpTestListener *)0x0) {
    HttpTestListener::~HttpTestListener(local_188);
    operator_delete(pHVar3,0x180);
  }
  pRVar2 = local_d0;
  if (local_d0 != (RkvstoreDescribeInstanceConfigRequestType *)0x0) {
    aliyun::Rkvstore::~Rkvstore((Rkvstore *)local_d0);
    operator_delete(pRVar2,0x38);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

static int test_describe_instance_config() {
  RkvstoreDescribeInstanceConfigRequestType req;
  RkvstoreDescribeInstanceConfigResponseType resp;
  Rkvstore* rkvstore = Rkvstore::CreateRkvstoreClient("cn-hangzhou", "my_appid", "my_secret");
  if(!rkvstore) return 0;
  rkvstore->SetProxyHost("127.0.0.1:12234");
  rkvstore->SetUseTls(false);
  HttpTestListener* listener = new HttpTestListener(12234);
  listener->SetResponseBody(test_describe_instance_config_response);
  listener->Start();
  req.owner_id = "OwnerId";
  req.resource_owner_account = "ResourceOwnerAccount";
  req.resource_owner_id = "ResourceOwnerId";
  req.owner_account = "OwnerAccount";
  req.instance_id = "InstanceId";
  int ret = rkvstore->DescribeInstanceConfig(req, &resp, NULL);
  listener->WaitComplete();
  delete listener;
  delete rkvstore;
}